

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  char *pcVar1;
  IRIns *pIVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  TValue TVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  IRIns *pIVar10;
  lua_Number lVar11;
  
  uVar8 = (ulong)ref;
  pIVar2 = T->ir;
  while( true ) {
    if ((uint)uVar8 < 0x8000) {
      lj_ir_kvalue(J->L,o,pIVar2 + uVar8);
      return;
    }
    uVar7 = (uint)*(ushort *)((long)pIVar2 + uVar8 * 8 + 6);
    if (((rfilt >> (uVar8 & 0x3f) & 1) != 0) &&
       (uVar9 = (ulong)(T->nins - 1), *(char *)((long)pIVar2 + uVar9 * 8 + 5) == '\x14')) {
      pIVar10 = pIVar2 + uVar9;
      do {
        if (((uint)(pIVar10->field_0).op1 == (uint)uVar8) && ((pIVar10->field_0).op2 <= snapno)) {
          uVar7 = (uint)(pIVar10->field_0).prev;
        }
        pcVar1 = (char *)((long)pIVar10 + -3);
        pIVar10 = pIVar10 + -1;
      } while (*pcVar1 == '\x14');
    }
    uVar5 = (uint)*(byte *)((long)pIVar2 + uVar8 * 8 + 4);
    if (0xff < uVar7) break;
    if (uVar7 < 0x80) {
      uVar6 = uVar5 & 0x1f;
      if (uVar6 - 0xf < 5) {
        lVar11 = (lua_Number)(int)ex->gpr[uVar7];
LAB_0013fd77:
        o->n = lVar11;
        return;
      }
      if (uVar6 == 3) {
        TVar4 = *(TValue *)(ex->gpr + uVar7);
        goto LAB_0013fd92;
      }
      if (uVar6 == 0xe) {
        lVar11 = ex->fpr[uVar7 - 0x10];
        goto LAB_0013fd77;
      }
      if ((byte)uVar6 < 3) goto LAB_0013fda8;
      aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
               (ex->gpr + uVar7);
      goto LAB_0013fda6;
    }
    uVar8 = (ulong)pIVar2[uVar8].field_0.op1;
  }
  uVar7 = uVar7 >> 8;
  uVar6 = uVar5 & 0x1f;
  if (uVar6 - 0xf < 5) {
    lVar11 = (lua_Number)ex->spill[uVar7];
    goto LAB_0013fd77;
  }
  if (((char)uVar6 == '\x03') || (uVar6 == 0xe)) {
    TVar4 = *(TValue *)(ex->spill + uVar7);
LAB_0013fd92:
    *o = TVar4;
    return;
  }
  aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
           (ex->spill + uVar7);
LAB_0013fda6:
  (o->field_2).field_0 = aVar3;
LAB_0013fda8:
  (o->field_2).it = ~(uVar5 & 0x1f);
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    lj_ir_kvalue(J->L, o, ir);
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
    } else {
      lua_assert(!irt_ispri(t));  /* PRI refs never have a spill slot. */
      setgcrefi(o->gcr, *sps);
      setitype(o, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lua_assert(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
    } else {
      if (!irt_ispri(t))
	setgcrefi(o->gcr, ex->gpr[r-RID_MIN_GPR]);
      setitype(o, irt_toitype(t));
    }
  }
}